

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_wrapper.cc
# Opt level: O0

fdb_status fdb_del_kv(fdb_kvs_handle *handle,void *key,size_t keylen)

{
  ulong in_RDX;
  long in_RSI;
  size_t in_RDI;
  fdb_doc *in_stack_00000010;
  fdb_kvs_handle *in_stack_00000018;
  fdb_status fs;
  fdb_doc *doc;
  void *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  fdb_doc **in_stack_ffffffffffffffd8;
  fdb_status local_4;
  
  if ((((in_RSI == 0) || (in_RDX == 0)) || (0xff80 < in_RDX)) ||
     ((*(long *)(in_RDI + 8) != 0 && (*(int *)(in_RDI + 0x74) - 0x100 < in_RDX)))) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    local_4 = fdb_doc_create(in_stack_ffffffffffffffd8,
                             (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,0,(void *)0x10c4d8,
                             in_RDI);
    if (local_4 == FDB_RESULT_SUCCESS) {
      local_4 = fdb_del(in_stack_00000018,in_stack_00000010);
      if (local_4 == FDB_RESULT_SUCCESS) {
        fdb_doc_free((fdb_doc *)0x10c57c);
      }
      else {
        fdb_doc_free((fdb_doc *)0x10c568);
      }
    }
    else {
      if (in_stack_ffffffffffffffd8 != (fdb_doc **)0x0) {
        fdb_doc_free((fdb_doc *)0x10c4f5);
      }
      fdb_log_impl((err_log_callback *)(in_RDI + 0x168),2,(fdb_status)(ulong)(uint)local_4,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/api_wrapper.cc"
                   ,"fdb_del_kv",0x8f,
                   "Warning: Failed to allocate fdb_doc instance for key \'%s\' in fdb_del_kv API.",
                   in_RSI);
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_del_kv(fdb_kvs_handle *handle,
                      const void *key, size_t keylen)
{
    fdb_doc *doc;
    fdb_status fs;

    if (key == NULL || keylen == 0 || keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    fs = fdb_doc_create(&doc, key, keylen, NULL, 0, NULL, 0);
    if (fs != FDB_RESULT_SUCCESS) { // LCOV_EXCL_START
        if (doc) {
            fdb_doc_free(doc);
        }
        fdb_log(&handle->log_callback, FDB_LOG_ERROR, fs,
                "Warning: Failed to allocate fdb_doc instance for key '%s' in "
                "fdb_del_kv API.", (const char *)key);
        return fs;
    } // LCOV_EXCL_STOP

    fs = fdb_del(handle, doc);
    if (fs != FDB_RESULT_SUCCESS) {
        fdb_doc_free(doc);
        return fs;
    }
    fdb_doc_free(doc);

    return fs;
}